

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int input_deinit(void)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  GSList *local_38;
  GSList *local_30;
  GSList *local_18;
  GSList *modules;
  GSList *ops;
  
  modules = plugin_ops;
  local_18 = g_modules;
  while (modules != (GSList *)0x0 && local_18 != (GSList *)0x0) {
    if ((modules->data != (gpointer)0x0) && (local_18->data != (gpointer)0x0)) {
      (**(code **)((long)modules->data + 0x68))();
      iVar1 = g_module_close(local_18->data);
      __stream = _stderr;
      if (iVar1 == 0) {
        uVar2 = g_module_error();
        fprintf(__stream,"%s\n",uVar2);
      }
    }
    if (modules == (GSList *)0x0) {
      local_30 = (GSList *)0x0;
    }
    else {
      local_30 = modules->next;
    }
    modules = local_30;
    if (local_18 == (GSList *)0x0) {
      local_38 = (GSList *)0x0;
    }
    else {
      local_38 = local_18->next;
    }
    local_18 = local_38;
  }
  g_slist_free(g_modules);
  g_slist_free(plugin_ops);
  g_slist_free(plugin_exts);
  return 0;
}

Assistant:

int
input_deinit(void)
{
	/* unload plugins */
	GSList *ops = plugin_ops;
	GSList *modules = g_modules;

	while (ops && modules) {
		if (ops->data && modules->data) {
			((struct input_ops *)ops->data)->exit_library();
			if (!g_module_close((GModule *)modules->data)) {
				fprintf(stderr, "%s\n", g_module_error());
			}
		}
		ops = g_slist_next(ops);
		modules = g_slist_next(modules);
	}
	g_slist_free(g_modules);
	g_slist_free(plugin_ops);
	g_slist_free(plugin_exts);
	return 0;
}